

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

int obj_nsiginlets(t_object *x)

{
  _inlet *p_Var1;
  t_pd p_Var2;
  int iVar3;
  _inlet **pp_Var4;
  
  iVar3 = 0;
  pp_Var4 = &x->te_inlet;
  while (p_Var1 = *pp_Var4, p_Var1 != (_inlet *)0x0) {
    iVar3 = iVar3 + (uint)(p_Var1->i_symfrom == &s_signal);
    pp_Var4 = &p_Var1->i_next;
  }
  p_Var2 = (x->te_g).g_pd;
  if (p_Var2->c_firstin != '\0') {
    iVar3 = (iVar3 + 1) - (uint)(p_Var2->c_floatsignalin == 0);
  }
  return iVar3;
}

Assistant:

int obj_nsiginlets(const t_object *x)
{
    int n;
    t_inlet *i;
    for (i = x->ob_inlet, n = 0; i; i = i->i_next)
        if (i->i_symfrom == &s_signal) n++;
    if (x->ob_pd->c_firstin && x->ob_pd->c_floatsignalin) n++;
    return (n);
}